

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O0

void google::protobuf::
     Join<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> start,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
               char *delim,string *result)

{
  bool bVar1;
  AlphaNum *in_RCX;
  AlphaNum *in_stack_00000018;
  string *in_stack_00000020;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> it;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  AlphaNum *in_stack_ffffffffffffffa0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  AlphaNum *local_20;
  
  local_20 = in_RCX;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_ffffffffffffffa0,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)), bVar1
        ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (bVar1) {
      std::__cxx11::string::append((char *)local_20);
    }
    in_stack_ffffffffffffffa0 = local_20;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_28);
    strings::AlphaNum::AlphaNum(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    StrAppend(in_stack_00000020,in_stack_00000018);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_28);
  }
  return;
}

Assistant:

void Join(Iterator start, Iterator end,
          const char* delim, string* result) {
  for (Iterator it = start; it != end; ++it) {
    if (it != start) {
      result->append(delim);
    }
    StrAppend(result, *it);
  }
}